

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O2

int map_goto(int state,int symbol)

{
  int iVar1;
  Yshort YVar2;
  Yshort YVar3;
  
  YVar3 = goto_map[symbol];
  YVar2 = goto_map[(long)symbol + 1];
  while( true ) {
    if (YVar2 < YVar3) {
      __assert_fail("low <= high",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChrisDodd[P]btyacc/lalr.c",
                    0xf4,"int map_goto(int, int)");
    }
    iVar1 = YVar2 + YVar3 >> 1;
    if (from_state[iVar1] == state) break;
    if (from_state[iVar1] < state) {
      YVar3 = iVar1 + 1;
    }
    else {
      YVar2 = iVar1 + -1;
    }
  }
  return iVar1;
}

Assistant:

int map_goto(int state, int symbol)
{
    register int high;
    register int low;
    register int middle;
    register int s;

    low = goto_map[symbol];
    high = goto_map[symbol + 1];

    for (;;)
    {
	assert(low <= high);
	middle = (low + high) >> 1;
	s = from_state[middle];
	if (s == state)
	    return (middle);
	else if (s < state)
	    low = middle + 1;
	else
	    high = middle - 1;
    }
}